

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O1

void test_list_iterate(void)

{
  long ***ppplVar1;
  undefined4 *puVar2;
  int iVar3;
  uint cond;
  long ****pppplVar4;
  LIST list;
  long ***local_40;
  long ***local_38;
  
  local_40 = (long ***)&local_40;
  local_38 = (long ***)&local_40;
  puVar2 = (undefined4 *)malloc(0x18);
  acutest_check_((uint)(puVar2 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x2d,"%s","d != NULL");
  *puVar2 = 1;
  *(long ****)(puVar2 + 2) = local_40;
  *(long *****)(puVar2 + 4) = &local_40;
  pppplVar4 = (long ****)(local_40 + 1);
  local_40 = (long ***)(puVar2 + 2);
  *pppplVar4 = (long ***)(puVar2 + 2);
  puVar2 = (undefined4 *)malloc(0x18);
  acutest_check_((uint)(puVar2 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x2d,"%s","d != NULL");
  *puVar2 = 2;
  *(long ****)(puVar2 + 2) = local_40;
  *(long *****)(puVar2 + 4) = &local_40;
  local_40[1] = (long **)(puVar2 + 2);
  local_40 = (long ***)(puVar2 + 2);
  puVar2 = (undefined4 *)malloc(0x18);
  acutest_check_((uint)(puVar2 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x2d,"%s","d != NULL");
  *puVar2 = 3;
  pppplVar4 = (long ****)(puVar2 + 2);
  *(long ****)(puVar2 + 2) = local_40;
  *(long *****)(puVar2 + 4) = &local_40;
  local_40[1] = (long **)pppplVar4;
  local_40 = (long ***)pppplVar4;
  if ((long ****)local_38 != &local_40) {
    iVar3 = 1;
    pppplVar4 = (long ****)local_38;
    do {
      acutest_check_((uint)(iVar3 == *(int *)(pppplVar4 + -1)),
                     "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                     ,0x51,"%s","data->value == n");
      pppplVar4 = (long ****)pppplVar4[1];
      iVar3 = iVar3 + 1;
    } while (pppplVar4 != &local_40);
  }
  if ((long ****)local_40 != &local_40) {
    iVar3 = 3;
    pppplVar4 = (long ****)local_40;
    do {
      acutest_check_((uint)(iVar3 == *(int *)(pppplVar4 + -1)),
                     "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                     ,0x57,"%s","data->value == n");
      iVar3 = iVar3 + -1;
      pppplVar4 = (long ****)*pppplVar4;
    } while (pppplVar4 != &local_40);
  }
  if ((long ****)local_38 == &local_40) {
    cond = 0;
  }
  else {
    iVar3 = 3;
    do {
      ppplVar1 = (long ***)*local_38;
      ppplVar1[1] = local_38[1];
      *local_38[1] = (long *)ppplVar1;
      free(local_38 + -1);
      iVar3 = iVar3 + -1;
    } while ((long ****)local_38 != &local_40);
    cond = (uint)(iVar3 == 0);
  }
  acutest_check_(cond,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x62,"%s","n == 3");
  return;
}

Assistant:

static void
test_list_iterate(void)
{
    LIST list;
    LIST_NODE* node;
    DATA* data;
    int n;

    /* Create simple list. */
    list_init(&list);
    list_append(&list, &alloc_data(1)->list_node);
    list_append(&list, &alloc_data(2)->list_node);
    list_append(&list, &alloc_data(3)->list_node);

    /* Iterate forward. */
    for(node = list_head(&list), n = 1; node != list_end(&list); node = list_next(node), n++) {
        data = LIST_DATA(node, DATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Iterate backward. */
    for(node = list_tail(&list), n = 3; node != list_end(&list); node = list_prev(node), n--) {
        data = LIST_DATA(node, DATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Clean up. */
    n = 0;
    while(!list_is_empty(&list)) {
        node = list_head(&list);
        list_remove(&list, node);
        free(LIST_DATA(node, DATA, list_node));
        n++;
    }
    TEST_CHECK(n == 3);
}